

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-run.c
# Opt level: O1

ztresult_t
zt_run_statements(ztast_statement_t *statements,ztstruct_t *meta,ztregion_t *regions,int nregions,
                 ztloader_t **loaders,int nloaders,void *structure,char *errbuf)

{
  ztast_value_type zVar1;
  int iVar2;
  ztast_assignment *pzVar3;
  ztfield_t *pzVar4;
  ztast_expr *pzVar5;
  ztast_value *pzVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  ztast_value_data zVar10;
  ztast_expr_type zVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  undefined8 uVar15;
  ztarray *pzVar16;
  ztregion_t *pzVar17;
  size_t sVar18;
  ulong uVar19;
  ztstruct *meta_00;
  ztast_value statements_00;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined4 in_register_0000008c;
  long lVar23;
  char **ppcVar24;
  ztast_id *unaff_R14;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  char *in_stack_ffffffffffffff90;
  
  lVar23 = CONCAT44(in_register_0000008c,nloaders);
  if (statements != (ztast_statement_t *)0x0) {
    do {
      if (statements->type != ZTSTMT_ASSIGNMENT) {
        *(undefined8 *)structure = 0x726f707075736e75;
        *(undefined4 *)((long)structure + 8) = 0x646574;
        return 0x30;
      }
      pzVar3 = (statements->u).assignment;
      uVar9 = meta->nfields;
      if ((int)uVar9 < 1) {
        uVar19 = 0;
      }
      else {
        unaff_R14 = pzVar3->id;
        ppcVar24 = &meta->fields->name;
        uVar19 = 0;
        do {
          iVar8 = strcmp(*ppcVar24,unaff_R14->name);
          if (iVar8 == 0) goto LAB_001018f4;
          uVar19 = uVar19 + 1;
          ppcVar24 = ppcVar24 + 9;
        } while (uVar9 != uVar19);
        uVar19 = (ulong)uVar9;
      }
LAB_001018f4:
      if ((uint)uVar19 == uVar9) {
        *(undefined8 *)((long)structure + 6) = 0x646c656966206e;
        *(undefined8 *)structure = 0x206e776f6e6b6e75;
      }
      pzVar4 = meta->fields;
      uVar19 = uVar19 & 0xffffffff;
      switch(pzVar4[uVar19].type) {
      case zttype_uchar:
        pzVar5 = pzVar3->expr;
        if (pzVar4[uVar19].nelems == 1) {
          if (pzVar5->type != ZTEXPR_VALUE) {
LAB_001020ff:
            *(undefined8 *)structure = 0x79742065756c6176;
            builtin_strncpy((char *)((long)structure + 8),"pe requi",8);
            *(undefined4 *)((long)structure + 0x10) = 0x646572;
            goto LAB_00102136;
          }
          if (((pzVar5->data).value)->type != ZTVAL_INTEGER) {
LAB_00101b58:
            uVar26._0_1_ = 'i';
            uVar26._1_1_ = 'n';
            uVar26._2_1_ = 't';
            uVar26._3_1_ = 'e';
            uVar27._0_1_ = 'g';
            uVar27._1_1_ = 'e';
            uVar27._2_1_ = 'r';
            uVar27._3_1_ = ' ';
            goto LAB_00101b5f;
          }
          uVar9 = (((pzVar5->data).value)->data).integer;
          if (0xff < uVar9) {
LAB_001021c7:
            builtin_strncpy((char *)((long)structure + 0x10),"geunknow",8);
            builtin_strncpy((char *)((long)structure + 0x18),"n error",8);
            *(undefined8 *)structure = 0x756f2065756c6176;
            builtin_strncpy((char *)((long)structure + 8),"t of ran",8);
            goto LAB_00102136;
          }
          *(char *)(lVar23 + pzVar4[uVar19].offset) = (char)uVar9;
        }
        else {
          if (pzVar5->type != ZTEXPR_INTARRAY) {
LAB_00101f4a:
            *(undefined8 *)structure = 0x2072656765746e69;
            builtin_strncpy((char *)((long)structure + 8),"array re",8);
            *(undefined8 *)((long)structure + 0xf) = 0x64657269757165;
            goto LAB_00102136;
          }
          piVar7 = *(int **)pzVar5->data;
          if ((piVar7 != (int *)0x0) && (0 < *piVar7)) {
            sVar18 = pzVar4[uVar19].offset;
            lVar22 = 0;
            do {
              uVar9 = *(uint *)(*(long *)(piVar7 + 2) + lVar22 * 4);
              if (0xff < uVar9) {
                builtin_strncpy((char *)((long)structure + 0x10),"geunknow",8);
                builtin_strncpy((char *)((long)structure + 0x18),"n error",8);
                *(undefined8 *)structure = 0x756f2065756c6176;
                builtin_strncpy((char *)((long)structure + 8),"t of ran",8);
                goto LAB_00102136;
              }
              *(char *)(sVar18 + lVar23 + lVar22) = (char)uVar9;
              lVar22 = lVar22 + 1;
            } while (lVar22 < *piVar7);
          }
        }
        break;
      case zttype_ucharptr:
        pzVar5 = pzVar3->expr;
        if (pzVar4[uVar19].nelems == 1) {
          if (pzVar5->type != ZTEXPR_VALUE) goto LAB_001020ff;
          if (((pzVar5->data).value)->type != ZTVAL_INTEGER) goto LAB_00101b58;
          uVar9 = (((pzVar5->data).value)->data).integer;
          if (0xff < uVar9) goto LAB_001021c7;
          **(undefined1 **)(lVar23 + pzVar4[uVar19].offset) = (char)uVar9;
        }
        else {
          if (pzVar5->type != ZTEXPR_INTARRAY) goto LAB_00101f4a;
          piVar7 = *(int **)pzVar5->data;
          if ((piVar7 != (int *)0x0) && (0 < *piVar7)) {
            lVar22 = *(long *)(lVar23 + pzVar4[uVar19].offset);
            lVar20 = 0;
            do {
              uVar9 = *(uint *)(*(long *)(piVar7 + 2) + lVar20 * 4);
              if (0xff < uVar9) {
                builtin_strncpy((char *)((long)structure + 0x10),"geunknow",8);
                builtin_strncpy((char *)((long)structure + 0x18),"n error",8);
                *(undefined8 *)structure = 0x756f2065756c6176;
                builtin_strncpy((char *)((long)structure + 8),"t of ran",8);
                goto LAB_00102136;
              }
              *(char *)(lVar22 + lVar20) = (char)uVar9;
              lVar20 = lVar20 + 1;
            } while (lVar20 < *piVar7);
          }
        }
        break;
      case zttype_ushort:
        pzVar5 = pzVar3->expr;
        if (pzVar4[uVar19].nelems == 1) {
          if (pzVar5->type != ZTEXPR_VALUE) goto LAB_001020ff;
          if (((pzVar5->data).value)->type != ZTVAL_INTEGER) goto LAB_00101b58;
          uVar9 = (((pzVar5->data).value)->data).integer;
          if (0xffff < uVar9) goto LAB_001021c7;
          *(short *)(lVar23 + pzVar4[uVar19].offset) = (short)uVar9;
        }
        else {
          if (pzVar5->type != ZTEXPR_INTARRAY) goto LAB_00101f4a;
          piVar7 = *(int **)pzVar5->data;
          if ((piVar7 != (int *)0x0) && (0 < *piVar7)) {
            sVar18 = pzVar4[uVar19].offset;
            lVar22 = 0;
            do {
              uVar9 = *(uint *)(*(long *)(piVar7 + 2) + lVar22 * 4);
              if (0xffff < uVar9) {
                builtin_strncpy((char *)((long)structure + 0x10),"geunknow",8);
                builtin_strncpy((char *)((long)structure + 0x18),"n error",8);
                *(undefined8 *)structure = 0x756f2065756c6176;
                builtin_strncpy((char *)((long)structure + 8),"t of ran",8);
                goto LAB_00102136;
              }
              *(short *)(sVar18 + lVar23 + lVar22 * 2) = (short)uVar9;
              lVar22 = lVar22 + 1;
            } while (lVar22 < *piVar7);
          }
        }
        break;
      case zttype_ushortptr:
        pzVar5 = pzVar3->expr;
        if (pzVar4[uVar19].nelems == 1) {
          if (pzVar5->type != ZTEXPR_VALUE) goto LAB_001020ff;
          if (((pzVar5->data).value)->type != ZTVAL_INTEGER) goto LAB_00101b58;
          uVar9 = (((pzVar5->data).value)->data).integer;
          if (0xffff < uVar9) goto LAB_001021c7;
          **(undefined2 **)(lVar23 + pzVar4[uVar19].offset) = (short)uVar9;
        }
        else {
          if (pzVar5->type != ZTEXPR_INTARRAY) goto LAB_00101f4a;
          piVar7 = *(int **)pzVar5->data;
          if ((piVar7 != (int *)0x0) && (0 < *piVar7)) {
            lVar22 = *(long *)(lVar23 + pzVar4[uVar19].offset);
            lVar20 = 0;
            do {
              uVar9 = *(uint *)(*(long *)(piVar7 + 2) + lVar20 * 4);
              if (0xffff < uVar9) {
                builtin_strncpy((char *)((long)structure + 0x10),"geunknow",8);
                builtin_strncpy((char *)((long)structure + 0x18),"n error",8);
                *(undefined8 *)structure = 0x756f2065756c6176;
                builtin_strncpy((char *)((long)structure + 8),"t of ran",8);
                goto LAB_00102136;
              }
              *(short *)(lVar22 + lVar20 * 2) = (short)uVar9;
              lVar20 = lVar20 + 1;
            } while (lVar20 < *piVar7);
          }
        }
        break;
      case zttype_uint:
        pzVar5 = pzVar3->expr;
        zVar11 = pzVar5->type;
        if (pzVar4[uVar19].nelems == 1) {
          if (zVar11 != ZTEXPR_VALUE) goto LAB_001020ff;
          if (((pzVar5->data).value)->type != ZTVAL_INTEGER) goto LAB_00101b58;
          zVar10 = ((pzVar5->data).value)->data;
LAB_00101c0e:
          *(ztast_value_data *)(lVar23 + pzVar4[uVar19].offset) = zVar10;
        }
        else {
          if (zVar11 == ZTEXPR_INTARRAY) {
            piVar7 = *(int **)pzVar5->data;
            if ((piVar7 != (int *)0x0) && (0 < *piVar7)) {
              sVar18 = pzVar4[uVar19].offset;
              lVar22 = *(long *)(piVar7 + 2);
              lVar20 = 0;
              do {
                *(undefined4 *)(sVar18 + lVar23 + lVar20 * 4) = *(undefined4 *)(lVar22 + lVar20 * 4)
                ;
                lVar20 = lVar20 + 1;
              } while (lVar20 < *piVar7);
            }
          }
          else {
LAB_00101fe5:
            *(undefined8 *)structure = 0x2072656765746e69;
            builtin_strncpy((char *)((long)structure + 8),"array re",8);
            *(undefined8 *)((long)structure + 0xf) = 0x64657269757165;
          }
LAB_00102005:
          unaff_R14 = (ztast_id *)0x30;
          if (zVar11 != ZTEXPR_INTARRAY) goto LAB_00102298;
        }
        break;
      case zttype_uintptr:
        pzVar5 = pzVar3->expr;
        zVar11 = pzVar5->type;
        if (pzVar4[uVar19].nelems != 1) {
          if (zVar11 != ZTEXPR_INTARRAY) goto LAB_00101fe5;
          piVar7 = *(int **)pzVar5->data;
          if ((piVar7 != (int *)0x0) && (0 < *piVar7)) {
            lVar22 = *(long *)(lVar23 + pzVar4[uVar19].offset);
            lVar20 = *(long *)(piVar7 + 2);
            lVar21 = 0;
            do {
              *(undefined4 *)(lVar22 + lVar21 * 4) = *(undefined4 *)(lVar20 + lVar21 * 4);
              lVar21 = lVar21 + 1;
            } while (lVar21 < *piVar7);
          }
          goto LAB_00102005;
        }
        if (zVar11 != ZTEXPR_VALUE) goto LAB_001020ff;
        if (((pzVar5->data).value)->type != ZTVAL_INTEGER) goto LAB_00101b58;
        **(ztast_value_data **)(lVar23 + pzVar4[uVar19].offset) = ((pzVar5->data).value)->data;
        break;
      case zttype_struct:
        pzVar5 = pzVar3->expr;
        if (pzVar4[uVar19].nelems == 1) {
          if (pzVar5->type == ZTEXPR_SCOPE) {
            iVar8 = (int)pzVar4[uVar19].offset + nloaders;
            statements_00 = *(pzVar5->data).value;
            meta_00 = pzVar4[uVar19].metadata;
            goto LAB_00101bab;
          }
LAB_00101f6f:
          *(undefined8 *)((long)structure + 7) = 0x64657269757165;
          *(undefined8 *)structure = 0x65722065706f6373;
          unaff_R14 = (ztast_id *)0x30;
          bVar25 = false;
LAB_00101f9a:
          if (bVar25) break;
        }
        else {
          if (pzVar5->type == ZTEXPR_SCOPEARRAY) {
            piVar7 = *(int **)pzVar5->data;
            if (piVar7 == (int *)0x0) {
              *(undefined8 *)structure = 0x79742065756c6176;
              builtin_strncpy((char *)((long)structure + 8),"pe requi",8);
              *(undefined4 *)((long)structure + 0x10) = 0x646572;
              goto LAB_0010223e;
            }
            if (*piVar7 < 1) {
              bVar25 = true;
            }
            else {
              sVar18 = pzVar4[uVar19].offset;
              lVar22 = 0;
              do {
                uVar9 = zt_run_statements((ztast_statement_t *)
                                          **(undefined8 **)(*(long *)(piVar7 + 2) + lVar22 * 8),
                                          pzVar4[uVar19].metadata,regions,nregions,loaders,
                                          (int)pzVar4[uVar19].size * (int)lVar22 +
                                          (int)sVar18 + nloaders,structure,in_stack_ffffffffffffff90
                                         );
                bVar25 = uVar9 == 0;
                unaff_R14 = (ztast_id *)((ulong)unaff_R14 & 0xffffffff);
                if (!bVar25) {
                  unaff_R14 = (ztast_id *)(ulong)uVar9;
                  break;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < *piVar7);
            }
          }
          else {
            *(undefined8 *)structure = 0x72612065706f6373;
            builtin_strncpy((char *)((long)structure + 8),"ray requ",8);
            *(undefined8 *)((long)structure + 0xd) = 0x64657269757165;
LAB_0010223e:
            unaff_R14 = (ztast_id *)0x30;
            bVar25 = false;
          }
          if (bVar25) break;
        }
        goto LAB_00102298;
      case zttype_structptr:
        pzVar5 = pzVar3->expr;
        if (pzVar4[uVar19].nelems == 1) {
          if (pzVar5->type != ZTEXPR_SCOPE) goto LAB_00101f6f;
          meta_00 = pzVar4[uVar19].metadata;
          iVar8 = (int)*(undefined8 *)(lVar23 + pzVar4[uVar19].offset);
          statements_00 = *(pzVar5->data).value;
LAB_00101bab:
          uVar9 = zt_run_statements((ztast_statement_t *)statements_00,meta_00,regions,nregions,
                                    loaders,iVar8,structure,in_stack_ffffffffffffff90);
          unaff_R14 = (ztast_id *)(ulong)uVar9;
          bVar25 = uVar9 == 0;
          goto LAB_00101f9a;
        }
        if (pzVar5->type == ZTEXPR_SCOPEARRAY) {
          piVar7 = *(int **)pzVar5->data;
          if (piVar7 == (int *)0x0) {
            *(undefined8 *)structure = 0x79742065756c6176;
            builtin_strncpy((char *)((long)structure + 8),"pe requi",8);
            *(undefined4 *)((long)structure + 0x10) = 0x646572;
            goto LAB_00102212;
          }
          if (*piVar7 < 1) {
            bVar25 = true;
          }
          else {
            uVar15 = *(undefined8 *)(lVar23 + pzVar4[uVar19].offset);
            lVar22 = 0;
            do {
              uVar9 = zt_run_statements((ztast_statement_t *)
                                        **(undefined8 **)(*(long *)(piVar7 + 2) + lVar22 * 8),
                                        pzVar4[uVar19].metadata,regions,nregions,loaders,
                                        (int)pzVar4[uVar19].size * (int)lVar22 + (int)uVar15,
                                        structure,in_stack_ffffffffffffff90);
              bVar25 = uVar9 == 0;
              unaff_R14 = (ztast_id *)((ulong)unaff_R14 & 0xffffffff);
              if (!bVar25) {
                unaff_R14 = (ztast_id *)(ulong)uVar9;
                break;
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < *piVar7);
          }
        }
        else {
          *(undefined8 *)structure = 0x72612065706f6373;
          builtin_strncpy((char *)((long)structure + 8),"ray requ",8);
          *(undefined8 *)((long)structure + 0xd) = 0x64657269757165;
LAB_00102212:
          unaff_R14 = (ztast_id *)0x30;
          bVar25 = false;
        }
        if (bVar25) break;
        goto LAB_00102298;
      case zttype_staticarrayidx:
        if (pzVar4[uVar19].nelems != 1) {
LAB_0010211a:
          *(undefined8 *)structure = 0x726f707075736e75;
          *(undefined4 *)((long)structure + 8) = 0x646574;
          goto LAB_00102136;
        }
        pzVar16 = pzVar4[uVar19].array;
        uVar12 = pzVar16->length / (ulong)(long)pzVar16->nelems;
        if (pzVar3->expr->type != ZTEXPR_VALUE) goto LAB_001020ff;
        sVar18 = pzVar4[uVar19].offset;
        pzVar6 = (pzVar3->expr->data).value;
        zVar1 = pzVar6->type;
        if (zVar1 == ZTVAL_NIL) {
LAB_001021e9:
          pvVar14 = (void *)0x0;
        }
        else {
          if (zVar1 != ZTVAL_INTEGER) {
LAB_00102262:
            *(undefined8 *)structure = 0x7463657078656e75;
            builtin_strncpy((char *)((long)structure + 8),"ed value",8);
            uVar15 = 0x65707974206575;
            goto LAB_00101b74;
          }
          iVar8 = (pzVar6->data).integer;
          lVar22 = (long)iVar8;
          if ((lVar22 < 0) || (pzVar16->nelems <= iVar8)) goto LAB_001021c7;
LAB_001021be:
          pvVar14 = (void *)(uVar12 * lVar22 + (long)pzVar16->base);
        }
        *(void **)(lVar23 + sVar18) = pvVar14;
        break;
      case zttype_arrayidx:
        if (nregions < 1) {
          uVar13 = 0;
        }
        else {
          uVar12 = 0;
          pzVar17 = regions;
          do {
            uVar13 = uVar12;
            if (pzVar4[uVar19].regionid == pzVar17->id) break;
            uVar12 = uVar12 + 1;
            pzVar17 = pzVar17 + 1;
            uVar13 = (ulong)(uint)nregions;
          } while ((uint)nregions != uVar12);
        }
        if ((int)uVar13 != nregions) {
          uVar13 = uVar13 & 0xffffffff;
          iVar8 = regions[uVar13].spec.nelems;
          uVar12 = regions[uVar13].spec.length / (ulong)(long)iVar8;
          if (pzVar4[uVar19].nelems == 1) {
            if (pzVar3->expr->type == ZTEXPR_VALUE) {
              sVar18 = pzVar4[uVar19].offset;
              pzVar6 = (pzVar3->expr->data).value;
              zVar1 = pzVar6->type;
              if (zVar1 != ZTVAL_NIL) {
                if (zVar1 != ZTVAL_INTEGER) goto LAB_00102262;
                iVar2 = (pzVar6->data).integer;
                lVar22 = (long)iVar2;
                if ((-1 < lVar22) && (iVar2 < iVar8)) {
                  pzVar16 = &regions[uVar13].spec;
                  goto LAB_001021be;
                }
                goto LAB_001021c7;
              }
              goto LAB_001021e9;
            }
            goto LAB_001020ff;
          }
          goto LAB_0010211a;
        }
        *(undefined8 *)((long)structure + 7) = 0x6e6f6967657220;
        *(undefined8 *)structure = 0x206e776f6e6b6e75;
        goto LAB_00102136;
      case zttype_version:
        if (pzVar4[uVar19].nelems != 1) goto LAB_0010211a;
        if (pzVar3->expr->type != ZTEXPR_VALUE) goto LAB_001020ff;
        pzVar6 = (pzVar3->expr->data).value;
        if (pzVar6->type == ZTVAL_DECIMAL) {
          zVar10 = pzVar6->data;
          if (999 < (uint)zVar10) goto LAB_001021c7;
          goto LAB_00101c0e;
        }
        uVar26._0_1_ = 'd';
        uVar26._1_1_ = 'e';
        uVar26._2_1_ = 'c';
        uVar26._3_1_ = 'i';
        uVar27._0_1_ = 'm';
        uVar27._1_1_ = 'a';
        uVar27._2_1_ = 'l';
        uVar27._3_1_ = ' ';
LAB_00101b5f:
        *(undefined4 *)structure = uVar26;
        *(undefined4 *)((long)structure + 4) = uVar27;
        builtin_strncpy((char *)((long)structure + 8),"type",4);
        builtin_strncpy((char *)((long)structure + 0xc)," req",4);
        uVar15 = 0x64657269757165;
LAB_00101b74:
        *(undefined8 *)((long)structure + 0xe) = uVar15;
LAB_00102136:
        unaff_R14 = (ztast_id *)0x30;
        goto LAB_00102298;
      case zttype_custom:
        if (pzVar4[uVar19].nelems != 1) goto LAB_0010211a;
        uVar9 = (*loaders[pzVar4[uVar19].typeidx])
                          (pzVar3->expr,(void *)(pzVar4[uVar19].offset + lVar23),(char *)structure);
        unaff_R14 = (ztast_id *)(ulong)uVar9;
        goto LAB_00102298;
      }
      unaff_R14 = (ztast_id *)0x0;
LAB_00102298:
      if ((int)unaff_R14 != 0) {
        return (int)unaff_R14;
      }
      statements = statements->next;
    } while (statements != (ztast_statement *)0x0);
  }
  return 0;
}

Assistant:

static ztresult_t zt_run_statements(const ztast_statement_t *statements,
                                    const ztstruct_t        *meta,
                                    const ztregion_t        *regions,
                                    int                      nregions,
                                    ztloader_t             **loaders,
                                    int                      nloaders,
                                    void                    *structure,
                                    char                    *errbuf)
{
  ztresult_t               rc;
  const ztast_statement_t *statement;

  for (statement = statements; statement; statement = statement->next)
  {
    switch (statement->type)
    {
    case ZTSTMT_ASSIGNMENT:
      rc = zt_do_assignment(statement->u.assignment,
                            meta,
                            regions,
                            nregions,
                            loaders,
                            nloaders,
                            structure,
                            errbuf);
      if (rc)
        return rc;
      break;

    default:
      return zt_mksyntax(errbuf, ztsyntx_UNSUPPORTED);
    }
  }

  return ztresult_OK;
}